

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int string_buffer_widen(StringBuffer *s,int size)

{
  JSRuntime *pJVar1;
  bool bVar2;
  JSString *pJVar3;
  long lVar4;
  int iVar5;
  size_t slack;
  ulong local_20;
  
  iVar5 = -1;
  if (s->error_status == 0) {
    pJVar3 = (JSString *)js_realloc2(s->ctx,s->str,(long)(size * 2) + 0x10,&local_20);
    if (pJVar3 == (JSString *)0x0) {
      pJVar1 = s->ctx->rt;
      (*(pJVar1->mf).js_free)(&pJVar1->malloc_state,s->str);
      s->str = (JSString *)0x0;
      s->len = 0;
      s->size = 0;
      s->error_status = -1;
    }
    else {
      lVar4 = (long)s->len;
      if (0 < (long)s->len) {
        do {
          *(ushort *)((long)&pJVar3->hash_next + lVar4 * 2 + 2) =
               (ushort)*(byte *)((long)&pJVar3->hash_next + lVar4 + 3);
          bVar2 = 1 < lVar4;
          lVar4 = lVar4 + -1;
        } while (bVar2);
      }
      s->is_wide_char = 1;
      s->size = (int)(local_20 >> 1) + size;
      s->str = pJVar3;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static no_inline int string_buffer_widen(StringBuffer *s, int size)
{
    JSString *str;
    size_t slack;
    int i;

    if (s->error_status)
        return -1;

    str = js_realloc2(s->ctx, s->str, sizeof(JSString) + (size << 1), &slack);
    if (!str)
        return string_buffer_set_error(s);
    size += slack >> 1;
    for(i = s->len; i-- > 0;) {
        str->u.str16[i] = str->u.str8[i];
    }
    s->is_wide_char = 1;
    s->size = size;
    s->str = str;
    return 0;
}